

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# co_routine.cpp
# Opt level: O0

void AddTail<stCoCondItem_t,stCoCond_t>(stCoCond_t *apLink,stCoCondItem_t *ap)

{
  stCoCondItem_t *ap_local;
  stCoCond_t *apLink_local;
  
  if (ap->pLink == (stCoCond_t *)0x0) {
    if (apLink->tail == (stCoCondItem_t *)0x0) {
      apLink->tail = ap;
      apLink->head = ap;
      ap->pPrev = (stCoCondItem_t *)0x0;
      ap->pNext = (stCoCondItem_t *)0x0;
    }
    else {
      apLink->tail->pNext = ap;
      ap->pNext = (stCoCondItem_t *)0x0;
      ap->pPrev = apLink->tail;
      apLink->tail = ap;
    }
    ap->pLink = apLink;
  }
  return;
}

Assistant:

void inline AddTail(TLink*apLink,TNode *ap)
{
	if( ap->pLink )
	{
		return ;
	}
	if(apLink->tail)
	{
		apLink->tail->pNext = (TNode*)ap;
		ap->pNext = NULL;
		ap->pPrev = apLink->tail;
		apLink->tail = ap;
	}
	else
	{
		apLink->head = apLink->tail = ap;
		ap->pNext = ap->pPrev = NULL;
	}
	ap->pLink = apLink;
}